

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::Bitstream::canBeSource
               (Type *target,StreamingConcatenationExpression *rhs,SourceLocation assignLoc,
               ASTContext *context)

{
  bool bVar1;
  Diagnostic *pDVar2;
  size_t arg;
  size_t arg_00;
  Diagnostic *diag;
  size_t sourceWidth;
  size_t targetWidth;
  ASTContext *context_local;
  StreamingConcatenationExpression *rhs_local;
  Type *target_local;
  SourceLocation assignLoc_local;
  
  bVar1 = Type::isBitstreamType(target,true);
  if (bVar1) {
    bVar1 = ASTContext::inUnevaluatedBranch(context);
    if (bVar1) {
      assignLoc_local._7_1_ = 1;
    }
    else {
      bVar1 = Type::isFixedSize(target);
      if (bVar1) {
        arg = Type::bitstreamWidth(target);
        arg_00 = StreamingConcatenationExpression::bitstreamWidth(rhs);
        if (arg < arg_00) {
          pDVar2 = ASTContext::addDiag(context,(DiagCode)0x2b0007,assignLoc);
          pDVar2 = Diagnostic::operator<<(pDVar2,arg);
          pDVar2 = Diagnostic::operator<<(pDVar2,arg_00);
          Diagnostic::operator<<(pDVar2,(rhs->super_Expression).sourceRange);
          assignLoc_local._7_1_ = 0;
        }
        else {
          assignLoc_local._7_1_ = 1;
        }
      }
      else {
        assignLoc_local._7_1_ = 1;
      }
    }
  }
  else {
    pDVar2 = ASTContext::addDiag(context,(DiagCode)0x2e0007,assignLoc);
    pDVar2 = ast::operator<<(pDVar2,target);
    Diagnostic::operator<<(pDVar2,(rhs->super_Expression).sourceRange);
    assignLoc_local._7_1_ = 0;
  }
  return (bool)assignLoc_local._7_1_;
}

Assistant:

bool Bitstream::canBeSource(const Type& target, const StreamingConcatenationExpression& rhs,
                            SourceLocation assignLoc, const ASTContext& context) {
    if (!target.isBitstreamType(true)) {
        context.addDiag(diag::BadStreamTargetType, assignLoc) << target << rhs.sourceRange;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch
    if (!target.isFixedSize())
        return true; // Sizes checked at constant evaluation or runtime

    auto targetWidth = target.bitstreamWidth();
    auto sourceWidth = rhs.bitstreamWidth();
    if (targetWidth < sourceWidth) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignLoc) << targetWidth << sourceWidth;
        diag << rhs.sourceRange;
        return false;
    }

    return true;
}